

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_bbdpre.c
# Opt level: O1

int CVBBDPrecGetNumGfnEvals(void *cvode_mem,long *ngevalsBBDP)

{
  long lVar1;
  int line;
  int iVar2;
  int error_code;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "Integrator memory is NULL.";
    iVar2 = -1;
    cvode_mem = (CVodeMem)0x0;
    error_code = -1;
    line = 0x18d;
  }
  else if (*(long *)((long)cvode_mem + 0x410) == 0) {
    msgfmt = "Linear solver memory is NULL. One of the SPILS linear solvers must be attached.";
    iVar2 = -2;
    error_code = -2;
    line = 0x195;
  }
  else {
    lVar1 = *(long *)(*(long *)((long)cvode_mem + 0x410) + 0xf0);
    if (lVar1 != 0) {
      *ngevalsBBDP = *(long *)(lVar1 + 0x90);
      return 0;
    }
    msgfmt = "BBD peconditioner memory is NULL. CVBBDPrecInit must be called.";
    iVar2 = -5;
    error_code = -5;
    line = 0x19d;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,line,"CVBBDPrecGetNumGfnEvals",
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_bbdpre.c"
                 ,msgfmt);
  return iVar2;
}

Assistant:

int CVBBDPrecGetNumGfnEvals(void* cvode_mem, long int* ngevalsBBDP)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  CVBBDPrecData pdata;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CVLS_MEM_NULL, __LINE__, __func__, __FILE__,
                   MSGBBD_MEM_NULL);
    return (CVLS_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  if (cv_mem->cv_lmem == NULL)
  {
    cvProcessError(cv_mem, CVLS_LMEM_NULL, __LINE__, __func__, __FILE__,
                   MSGBBD_LMEM_NULL);
    return (CVLS_LMEM_NULL);
  }
  cvls_mem = (CVLsMem)cv_mem->cv_lmem;

  if (cvls_mem->P_data == NULL)
  {
    cvProcessError(cv_mem, CVLS_PMEM_NULL, __LINE__, __func__, __FILE__,
                   MSGBBD_PMEM_NULL);
    return (CVLS_PMEM_NULL);
  }
  pdata = (CVBBDPrecData)cvls_mem->P_data;

  *ngevalsBBDP = pdata->nge;

  return (CVLS_SUCCESS);
}